

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseUnaryMinus(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  ParseState *this_00;
  long *plVar1;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar2;
  byte in_R8B;
  Value VVar3;
  code *local_1c0;
  code *local_188;
  Value local_148;
  Value local_138;
  Value local_128;
  TACLine local_118;
  int local_b8;
  undefined4 local_b4;
  int tempNum;
  undefined1 local_a8 [8];
  Value val;
  Token local_90;
  Lexer local_60;
  Token local_58;
  code *local_38;
  offset_in_Parser_to_subr nextLevel;
  byte local_22;
  byte local_21;
  bool statementStart_local;
  Lexer *pLStack_20;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_22 = in_R8B & 1;
  local_38 = ParseNew;
  nextLevel = 0;
  local_21 = statementStart;
  pLStack_20 = this_01;
  tokens_local = tokens;
  this_local = this;
  Lexer::Peek(&local_58,this_01);
  Token::~Token(&local_58);
  if (local_58.type == OpMinus) {
    Lexer::Dequeue(&local_90,this_01);
    Token::~Token(&local_90);
    Lexer::Lexer((Lexer *)&val.data,this_01);
    AllowLineBreak((Lexer *)&val.data);
    Lexer::~Lexer((Lexer *)&val.data);
    plVar1 = (long *)((long)&tokens->ls + nextLevel);
    if (((ulong)local_38 & 1) == 0) {
      local_1c0 = local_38;
    }
    else {
      local_1c0 = *(code **)(local_38 + *plVar1 + -1);
    }
    Lexer::Lexer((Lexer *)&tempNum,this_01);
    (*local_1c0)(local_a8,plVar1,(Lexer *)&tempNum,0);
    Lexer::~Lexer((Lexer *)&tempNum);
    if (local_a8[0] == Number) {
      val._0_8_ = val._0_8_ ^ 0x8000000000000000;
      Value::Value((Value *)this,(Value *)local_a8);
    }
    else {
      local_b8 = *(int *)&((tokens[6].ls)->pending).ls;
      *(int *)&((tokens[6].ls)->pending).ls = local_b8 + 1;
      this_00 = (ParseState *)tokens[6].ls;
      Value::Temp(&local_128,local_b8);
      Value::Value(&local_138,(Value *)Value::zero);
      Value::Value(&local_148,(Value *)local_a8);
      TACLine::TACLine(&local_118,&local_128,AMinusB,&local_138,&local_148);
      ParseState::Add(this_00,&local_118);
      TACLine::~TACLine(&local_118);
      Value::~Value(&local_148);
      Value::~Value(&local_138);
      Value::~Value(&local_128);
      Value::Temp((Value *)this,local_b8);
    }
    local_b4 = 1;
    Value::~Value((Value *)local_a8);
    aVar2 = extraout_RDX_00;
  }
  else {
    plVar1 = (long *)((long)&tokens->ls + nextLevel);
    if (((ulong)local_38 & 1) == 0) {
      local_188 = local_38;
    }
    else {
      local_188 = *(code **)(local_38 + *plVar1 + -1);
    }
    Lexer::Lexer(&local_60,this_01);
    (*local_188)(this,plVar1,&local_60,local_21 & 1,local_22 & 1);
    Lexer::~Lexer(&local_60);
    aVar2 = extraout_RDX;
  }
  VVar3.data.number = aVar2.number;
  VVar3._0_8_ = this;
  return VVar3;
}

Assistant:

Value Parser::ParseUnaryMinus(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseNew;
		if (tokens.Peek().type != Token::Type::OpMinus) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();		// skip '-'

		AllowLineBreak(tokens); // allow a line break after a unary operator
		
		Value val = (*this.*nextLevel)(tokens, false, false);
		if (val.type == ValueType::Number) {
			// If what follows is a numeric literal, just invert it and be done!
			val.data.number = -val.data.number;
			return val;
		}
		// Otherwise, subtract it from 0 and return a new temporary.
		int tempNum = output->nextTempNum++;
		output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::AMinusB, Value::zero, val));
		return Value::Temp(tempNum);
	}